

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

char * ImGui::GetKeyName(ImGuiKey key)

{
  uint uVar1;
  uint uVar2;
  
  if (key < ImGuiKey_NamedKey_BEGIN) {
    key = (GImGui->IO).KeyMap[key];
    if (key == ~ImGuiKey_KeysData_OFFSET) {
      return "N/A";
    }
    if (key == ImGuiKey_KeysData_OFFSET) {
      return "None";
    }
  }
  if ((key & ImGuiMod_Mask_) == ImGuiKey_KeysData_OFFSET) {
    uVar2 = key - ImGuiKey_NamedKey_BEGIN;
    if (0x8b < uVar2) {
      return "Unknown";
    }
  }
  else {
    uVar2 = key - ImGuiKey_ModCtrl >> 0xc;
    uVar1 = key << 0x14 | uVar2;
    if ((7 < uVar1) || ((0x8bU >> (uVar2 & 0x1f) & 1) == 0)) {
      return "Unknown";
    }
    uVar2 = *(uint *)(&DAT_0025af10 + (ulong)uVar1 * 4);
  }
  return _ZL9GKeyNames_rel + *(int *)(_ZL9GKeyNames_rel + (ulong)uVar2 * 4);
}

Assistant:

inline bool             IsLegacyKey(ImGuiKey key)                                   { return key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_LegacyNativeKey_END; }